

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_scalar_function_info.cpp
# Opt level: O1

unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> __thiscall
duckdb::AddScalarFunctionOverloadInfo::Copy(AddScalarFunctionOverloadInfo *this)

{
  pointer pCVar1;
  pointer *__ptr;
  AlterInfo *in_RSI;
  _Head_base<0UL,_duckdb::CreateScalarFunctionInfo_*,_false> local_88;
  _Head_base<0UL,_duckdb::CreateScalarFunctionInfo_*,_false> local_80;
  AlterEntryData local_78;
  
  AlterInfo::GetAlterEntryData(&local_78,in_RSI);
  pCVar1 = unique_ptr<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>,_true>
           ::operator->((unique_ptr<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>,_true>
                         *)(in_RSI + 1));
  (*(pCVar1->super_CreateFunctionInfo).super_CreateInfo.super_ParseInfo._vptr_ParseInfo[3])
            (&local_88,pCVar1);
  local_80._M_head_impl = local_88._M_head_impl;
  local_88._M_head_impl = (CreateScalarFunctionInfo *)0x0;
  make_uniq_base<duckdb::AlterInfo,duckdb::AddScalarFunctionOverloadInfo,duckdb::AlterEntryData,duckdb::unique_ptr<duckdb::CreateScalarFunctionInfo,std::default_delete<duckdb::CreateScalarFunctionInfo>,true>>
            ((duckdb *)this,&local_78,
             (unique_ptr<duckdb::CreateScalarFunctionInfo,_std::default_delete<duckdb::CreateScalarFunctionInfo>,_true>
              *)&local_80);
  if (local_80._M_head_impl != (CreateScalarFunctionInfo *)0x0) {
    (*((local_80._M_head_impl)->super_CreateFunctionInfo).super_CreateInfo.super_ParseInfo.
      _vptr_ParseInfo[1])();
  }
  local_80._M_head_impl = (CreateScalarFunctionInfo *)0x0;
  if (local_88._M_head_impl != (CreateScalarFunctionInfo *)0x0) {
    (*((local_88._M_head_impl)->super_CreateFunctionInfo).super_CreateInfo.super_ParseInfo.
      _vptr_ParseInfo[1])();
  }
  local_88._M_head_impl = (CreateScalarFunctionInfo *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.name._M_dataplus._M_p != &local_78.name.field_2) {
    operator_delete(local_78.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.schema._M_dataplus._M_p != &local_78.schema.field_2) {
    operator_delete(local_78.schema._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.catalog._M_dataplus._M_p != &local_78.catalog.field_2) {
    operator_delete(local_78.catalog._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)
         (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)this;
}

Assistant:

unique_ptr<AlterInfo> AddScalarFunctionOverloadInfo::Copy() const {
	return make_uniq_base<AlterInfo, AddScalarFunctionOverloadInfo>(
	    GetAlterEntryData(), unique_ptr_cast<CreateInfo, CreateScalarFunctionInfo>(new_overloads->Copy()));
}